

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O2

void iadst8x8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  __m256i alVar3;
  __m256i alVar4;
  undefined1 auVar5 [32];
  __m256i alVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  byte bVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  __m256i in0;
  __m256i in1;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  
  lVar11 = (long)bit * 0x100;
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x220);
  iVar12 = -iVar2;
  iVar13 = 1 << ((char)bit - 1U & 0x1f);
  iVar14 = bd + (uint)(do_cols == 0) * 2;
  iVar10 = 0x8000;
  if (0xf < iVar14 + 6) {
    iVar10 = 1 << ((char)iVar14 + 5U & 0x1f);
  }
  iVar14 = -iVar10;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x170);
  auVar25._4_4_ = uVar1;
  auVar25._0_4_ = uVar1;
  auVar25._8_4_ = uVar1;
  auVar25._12_4_ = uVar1;
  auVar25._16_4_ = uVar1;
  auVar25._20_4_ = uVar1;
  auVar25._24_4_ = uVar1;
  auVar25._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x250);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  auVar26._16_4_ = uVar1;
  auVar26._20_4_ = uVar1;
  auVar26._24_4_ = uVar1;
  auVar26._28_4_ = uVar1;
  auVar19._4_4_ = iVar13;
  auVar19._0_4_ = iVar13;
  auVar19._8_4_ = iVar13;
  auVar19._12_4_ = iVar13;
  auVar19._16_4_ = iVar13;
  auVar19._20_4_ = iVar13;
  auVar19._24_4_ = iVar13;
  auVar19._28_4_ = iVar13;
  auVar16 = vpmulld_avx2((undefined1  [32])in[7],auVar25);
  auVar5 = vpmulld_avx2((undefined1  [32])*in,auVar26);
  auVar16 = vpaddd_avx2(auVar16,auVar19);
  auVar16 = vpaddd_avx2(auVar16,auVar5);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1b0);
  auVar30._4_4_ = uVar1;
  auVar30._0_4_ = uVar1;
  auVar30._8_4_ = uVar1;
  auVar30._12_4_ = uVar1;
  auVar30._16_4_ = uVar1;
  auVar30._20_4_ = uVar1;
  auVar30._24_4_ = uVar1;
  auVar30._28_4_ = uVar1;
  auVar5 = vpmulld_avx2((undefined1  [32])in[7],auVar26);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x210);
  auVar28._4_4_ = uVar1;
  auVar28._0_4_ = uVar1;
  auVar28._8_4_ = uVar1;
  auVar28._12_4_ = uVar1;
  auVar28._16_4_ = uVar1;
  auVar28._20_4_ = uVar1;
  auVar28._24_4_ = uVar1;
  auVar28._28_4_ = uVar1;
  auVar25 = vpmulld_avx2(auVar25,(undefined1  [32])*in);
  auVar5 = vpaddd_avx2(auVar5,auVar19);
  auVar7 = vpsubd_avx2(auVar5,auVar25);
  auVar5 = vpmulld_avx2((undefined1  [32])in[5],auVar30);
  auVar25 = vpmulld_avx2((undefined1  [32])in[2],auVar28);
  auVar5 = vpaddd_avx2(auVar5,auVar19);
  auVar5 = vpaddd_avx2(auVar5,auVar25);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1f0);
  auVar27._4_4_ = uVar1;
  auVar27._0_4_ = uVar1;
  auVar27._8_4_ = uVar1;
  auVar27._12_4_ = uVar1;
  auVar27._16_4_ = uVar1;
  auVar27._20_4_ = uVar1;
  auVar27._24_4_ = uVar1;
  auVar27._28_4_ = uVar1;
  auVar25 = vpmulld_avx2((undefined1  [32])in[5],auVar28);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1d0);
  auVar29._4_4_ = uVar1;
  auVar29._0_4_ = uVar1;
  auVar29._8_4_ = uVar1;
  auVar29._12_4_ = uVar1;
  auVar29._16_4_ = uVar1;
  auVar29._20_4_ = uVar1;
  auVar29._24_4_ = uVar1;
  auVar29._28_4_ = uVar1;
  auVar26 = vpmulld_avx2(auVar30,(undefined1  [32])in[2]);
  auVar25 = vpaddd_avx2(auVar25,auVar19);
  auVar30 = vpsubd_avx2(auVar25,auVar26);
  auVar25 = vpmulld_avx2((undefined1  [32])in[3],auVar27);
  auVar26 = vpmulld_avx2((undefined1  [32])in[4],auVar29);
  auVar25 = vpaddd_avx2(auVar25,auVar19);
  auVar25 = vpaddd_avx2(auVar26,auVar25);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x230);
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  auVar17._16_4_ = uVar1;
  auVar17._20_4_ = uVar1;
  auVar17._24_4_ = uVar1;
  auVar17._28_4_ = uVar1;
  iVar10 = iVar10 + -1;
  auVar26 = vpmulld_avx2((undefined1  [32])in[3],auVar29);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 400);
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  auVar23._16_4_ = uVar1;
  auVar23._20_4_ = uVar1;
  auVar23._24_4_ = uVar1;
  auVar23._28_4_ = uVar1;
  auVar27 = vpmulld_avx2(auVar27,(undefined1  [32])in[4]);
  auVar26 = vpaddd_avx2(auVar26,auVar19);
  auVar8 = vpsubd_avx2(auVar26,auVar27);
  auVar26 = vpmulld_avx2((undefined1  [32])in[1],auVar17);
  auVar27 = vpmulld_avx2((undefined1  [32])in[6],auVar23);
  auVar26 = vpaddd_avx2(auVar26,auVar19);
  auVar26 = vpaddd_avx2(auVar27,auVar26);
  auVar27 = vpmulld_avx2((undefined1  [32])in[1],auVar23);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1a0);
  auVar21._4_4_ = uVar1;
  auVar21._0_4_ = uVar1;
  auVar21._8_4_ = uVar1;
  auVar21._12_4_ = uVar1;
  auVar21._16_4_ = uVar1;
  auVar21._20_4_ = uVar1;
  auVar21._24_4_ = uVar1;
  auVar21._28_4_ = uVar1;
  auVar24._4_4_ = iVar2;
  auVar24._0_4_ = iVar2;
  auVar24._8_4_ = iVar2;
  auVar24._12_4_ = iVar2;
  auVar24._16_4_ = iVar2;
  auVar24._20_4_ = iVar2;
  auVar24._24_4_ = iVar2;
  auVar24._28_4_ = iVar2;
  auVar23 = vpsrad_avx2(auVar16,ZEXT416((uint)bit));
  auVar28 = vpsrad_avx2(auVar7,ZEXT416((uint)bit));
  auVar18 = ZEXT416((uint)bit);
  auVar29 = vpsrad_avx2(auVar5,auVar18);
  auVar30 = vpsrad_avx2(auVar30,auVar18);
  auVar25 = vpsrad_avx2(auVar25,auVar18);
  auVar8 = vpsrad_avx2(auVar8,auVar18);
  auVar15._4_4_ = iVar14;
  auVar15._0_4_ = iVar14;
  auVar15._8_4_ = iVar14;
  auVar15._12_4_ = iVar14;
  auVar15._16_4_ = iVar14;
  auVar15._20_4_ = iVar14;
  auVar15._24_4_ = iVar14;
  auVar15._28_4_ = iVar14;
  auVar18 = ZEXT416((uint)bit);
  auVar26 = vpsrad_avx2(auVar26,auVar18);
  auVar5 = vpmulld_avx2(auVar17,(undefined1  [32])in[6]);
  auVar16 = vpaddd_avx2(auVar27,auVar19);
  auVar16 = vpsubd_avx2(auVar16,auVar5);
  auVar27 = vpsrad_avx2(auVar16,auVar18);
  auVar20._4_4_ = iVar10;
  auVar20._0_4_ = iVar10;
  auVar20._8_4_ = iVar10;
  auVar20._12_4_ = iVar10;
  auVar20._16_4_ = iVar10;
  auVar20._20_4_ = iVar10;
  auVar20._24_4_ = iVar10;
  auVar20._28_4_ = iVar10;
  auVar16 = vpaddd_avx2(auVar25,auVar23);
  auVar5 = vpsubd_avx2(auVar23,auVar25);
  auVar5 = vpmaxsd_avx2(auVar5,auVar15);
  auVar7 = vpminsd_avx2(auVar5,auVar20);
  auVar5 = vpaddd_avx2(auVar8,auVar28);
  auVar25 = vpsubd_avx2(auVar28,auVar8);
  auVar25 = vpmaxsd_avx2(auVar25,auVar15);
  auVar28 = vpminsd_avx2(auVar25,auVar20);
  auVar25 = vpaddd_avx2(auVar26,auVar29);
  auVar29 = vpsubd_avx2(auVar29,auVar26);
  auVar26 = vpaddd_avx2(auVar30,auVar27);
  auVar30 = vpsubd_avx2(auVar30,auVar27);
  auVar27 = vpmulld_avx2(auVar7,auVar21);
  auVar23 = vpmulld_avx2(auVar28,auVar24);
  auVar27 = vpaddd_avx2(auVar27,auVar19);
  auVar27 = vpaddd_avx2(auVar27,auVar23);
  auVar31._4_4_ = iVar12;
  auVar31._0_4_ = iVar12;
  auVar31._8_4_ = iVar12;
  auVar31._12_4_ = iVar12;
  auVar31._16_4_ = iVar12;
  auVar31._20_4_ = iVar12;
  auVar31._24_4_ = iVar12;
  auVar31._28_4_ = iVar12;
  auVar23 = vpmaxsd_avx2(auVar29,auVar15);
  auVar29 = vpminsd_avx2(auVar23,auVar20);
  auVar23 = vpmaxsd_avx2(auVar30,auVar15);
  auVar30 = vpminsd_avx2(auVar23,auVar20);
  auVar23 = vpmulld_avx2(auVar7,auVar24);
  auVar7 = vpmulld_avx2(auVar21,auVar28);
  auVar23 = vpaddd_avx2(auVar23,auVar19);
  auVar8 = vpsubd_avx2(auVar23,auVar7);
  auVar23 = vpmulld_avx2(auVar29,auVar31);
  auVar7 = vpmulld_avx2(auVar30,auVar21);
  auVar23 = vpaddd_avx2(auVar23,auVar19);
  auVar23 = vpaddd_avx2(auVar23,auVar7);
  auVar29 = vpmulld_avx2(auVar29,auVar21);
  auVar30 = vpmulld_avx2(auVar31,auVar30);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1e0);
  auVar22._4_4_ = uVar1;
  auVar22._0_4_ = uVar1;
  auVar22._8_4_ = uVar1;
  auVar22._12_4_ = uVar1;
  auVar22._16_4_ = uVar1;
  auVar22._20_4_ = uVar1;
  auVar22._24_4_ = uVar1;
  auVar22._28_4_ = uVar1;
  auVar16 = vpmaxsd_avx2(auVar16,auVar15);
  auVar7 = vpminsd_avx2(auVar16,auVar20);
  auVar16 = vpmaxsd_avx2(auVar5,auVar15);
  auVar28 = vpminsd_avx2(auVar16,auVar20);
  auVar16 = vpmaxsd_avx2(auVar25,auVar15);
  auVar25 = vpminsd_avx2(auVar16,auVar20);
  auVar5 = vpmaxsd_avx2(auVar26,auVar15);
  auVar27 = vpsrad_avx2(auVar27,auVar18);
  auVar8 = vpsrad_avx2(auVar8,auVar18);
  auVar23 = vpsrad_avx2(auVar23,auVar18);
  auVar16 = vpaddd_avx2(auVar29,auVar19);
  auVar16 = vpsubd_avx2(auVar16,auVar30);
  auVar29 = vpsrad_avx2(auVar16,auVar18);
  auVar26 = vpminsd_avx2(auVar5,auVar20);
  auVar16 = vpaddd_avx2(auVar25,auVar7);
  auVar7 = vpsubd_avx2(auVar7,auVar25);
  auVar5 = vpaddd_avx2(auVar26,auVar28);
  auVar28 = vpsubd_avx2(auVar28,auVar26);
  auVar25 = vpaddd_avx2(auVar23,auVar27);
  auVar30 = vpsubd_avx2(auVar27,auVar23);
  auVar26 = vpaddd_avx2(auVar29,auVar8);
  auVar29 = vpsubd_avx2(auVar8,auVar29);
  auVar16 = vpmaxsd_avx2(auVar16,auVar15);
  auVar27 = vpmaxsd_avx2(auVar7,auVar15);
  auVar5 = vpmaxsd_avx2(auVar5,auVar15);
  auVar23 = vpmaxsd_avx2(auVar28,auVar15);
  auVar25 = vpmaxsd_avx2(auVar25,auVar15);
  auVar7 = vpmaxsd_avx2(auVar30,auVar15);
  auVar26 = vpmaxsd_avx2(auVar26,auVar15);
  auVar28 = vpmaxsd_avx2(auVar29,auVar15);
  alVar3 = (__m256i)vpminsd_avx2(auVar16,auVar20);
  auVar16 = vpminsd_avx2(auVar27,auVar20);
  auVar27 = vpminsd_avx2(auVar5,auVar20);
  auVar5 = vpminsd_avx2(auVar23,auVar20);
  auVar25 = vpminsd_avx2(auVar25,auVar20);
  auVar23 = vpminsd_avx2(auVar7,auVar20);
  alVar4 = (__m256i)vpminsd_avx2(auVar26,auVar20);
  auVar26 = vpminsd_avx2(auVar28,auVar20);
  auVar16 = vpmulld_avx2(auVar16,auVar22);
  auVar7 = vpmulld_avx2(auVar5,auVar22);
  auVar16 = vpaddd_avx2(auVar16,auVar19);
  auVar5 = vpaddd_avx2(auVar16,auVar7);
  auVar7 = vpsubd_avx2(auVar16,auVar7);
  auVar16 = vpmulld_avx2(auVar23,auVar22);
  auVar26 = vpmulld_avx2(auVar26,auVar22);
  auVar23 = vpsrad_avx2(auVar5,auVar18);
  alVar6 = (__m256i)vpsrad_avx2(auVar7,auVar18);
  auVar16 = vpaddd_avx2(auVar16,auVar19);
  auVar5 = vpaddd_avx2(auVar16,auVar26);
  in1 = (__m256i)vpsrad_avx2(auVar5,ZEXT416((uint)bit));
  auVar16 = vpsubd_avx2(auVar16,auVar26);
  in0 = (__m256i)vpsrad_avx2(auVar16,ZEXT416((uint)bit));
  if (do_cols == 0) {
    bVar9 = 10;
    if (10 < bd) {
      bVar9 = (byte)bd;
    }
    local_a0 = 0x20 << (bVar9 & 0x1f);
    local_80 = -local_a0;
    local_a0 = local_a0 + -1;
    iStack_9c = local_a0;
    iStack_98 = local_a0;
    iStack_94 = local_a0;
    iStack_90 = local_a0;
    iStack_8c = local_a0;
    iStack_88 = local_a0;
    iStack_84 = local_a0;
    iStack_7c = local_80;
    iStack_78 = local_80;
    iStack_74 = local_80;
    iStack_70 = local_80;
    iStack_6c = local_80;
    iStack_68 = local_80;
    iStack_64 = local_80;
    neg_shift_avx2(in0,in1,out,out + 1,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 2,out + 3,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 4,out + 5,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 6,out + 7,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
  }
  else {
    *out = alVar3;
    auVar16 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    alVar3 = (__m256i)vpsubd_avx2(auVar16,auVar25);
    out[1] = alVar3;
    out[2] = in1;
    alVar3 = (__m256i)vpsubd_avx2(auVar16,auVar23);
    out[3] = alVar3;
    out[4] = alVar6;
    alVar3 = (__m256i)vpsubd_avx2(auVar16,(undefined1  [32])in0);
    out[5] = alVar3;
    out[6] = alVar4;
    alVar3 = (__m256i)vpsubd_avx2(auVar16,auVar27);
    out[7] = alVar3;
  }
  return;
}

Assistant:

static void iadst8x8_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                          int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospi20 = _mm256_set1_epi32(cospi[20]);
  const __m256i cospi44 = _mm256_set1_epi32(cospi[44]);
  const __m256i cospi36 = _mm256_set1_epi32(cospi[36]);
  const __m256i cospi28 = _mm256_set1_epi32(cospi[28]);
  const __m256i cospi52 = _mm256_set1_epi32(cospi[52]);
  const __m256i cospi12 = _mm256_set1_epi32(cospi[12]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const __m256i kZero = _mm256_setzero_si256();
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);
  __m256i u[8], v[8], x;

  // stage 0
  // stage 1
  // stage 2

  u[0] = _mm256_mullo_epi32(in[7], cospi4);
  x = _mm256_mullo_epi32(in[0], cospi60);
  u[0] = _mm256_add_epi32(u[0], x);
  u[0] = _mm256_add_epi32(u[0], rnding);
  u[0] = _mm256_srai_epi32(u[0], bit);

  u[1] = _mm256_mullo_epi32(in[7], cospi60);
  x = _mm256_mullo_epi32(in[0], cospi4);
  u[1] = _mm256_sub_epi32(u[1], x);
  u[1] = _mm256_add_epi32(u[1], rnding);
  u[1] = _mm256_srai_epi32(u[1], bit);

  u[2] = _mm256_mullo_epi32(in[5], cospi20);
  x = _mm256_mullo_epi32(in[2], cospi44);
  u[2] = _mm256_add_epi32(u[2], x);
  u[2] = _mm256_add_epi32(u[2], rnding);
  u[2] = _mm256_srai_epi32(u[2], bit);

  u[3] = _mm256_mullo_epi32(in[5], cospi44);
  x = _mm256_mullo_epi32(in[2], cospi20);
  u[3] = _mm256_sub_epi32(u[3], x);
  u[3] = _mm256_add_epi32(u[3], rnding);
  u[3] = _mm256_srai_epi32(u[3], bit);

  u[4] = _mm256_mullo_epi32(in[3], cospi36);
  x = _mm256_mullo_epi32(in[4], cospi28);
  u[4] = _mm256_add_epi32(u[4], x);
  u[4] = _mm256_add_epi32(u[4], rnding);
  u[4] = _mm256_srai_epi32(u[4], bit);

  u[5] = _mm256_mullo_epi32(in[3], cospi28);
  x = _mm256_mullo_epi32(in[4], cospi36);
  u[5] = _mm256_sub_epi32(u[5], x);
  u[5] = _mm256_add_epi32(u[5], rnding);
  u[5] = _mm256_srai_epi32(u[5], bit);

  u[6] = _mm256_mullo_epi32(in[1], cospi52);
  x = _mm256_mullo_epi32(in[6], cospi12);
  u[6] = _mm256_add_epi32(u[6], x);
  u[6] = _mm256_add_epi32(u[6], rnding);
  u[6] = _mm256_srai_epi32(u[6], bit);

  u[7] = _mm256_mullo_epi32(in[1], cospi12);
  x = _mm256_mullo_epi32(in[6], cospi52);
  u[7] = _mm256_sub_epi32(u[7], x);
  u[7] = _mm256_add_epi32(u[7], rnding);
  u[7] = _mm256_srai_epi32(u[7], bit);

  // stage 3
  addsub_avx2(u[0], u[4], &v[0], &v[4], &clamp_lo, &clamp_hi);
  addsub_avx2(u[1], u[5], &v[1], &v[5], &clamp_lo, &clamp_hi);
  addsub_avx2(u[2], u[6], &v[2], &v[6], &clamp_lo, &clamp_hi);
  addsub_avx2(u[3], u[7], &v[3], &v[7], &clamp_lo, &clamp_hi);

  // stage 4
  u[0] = v[0];
  u[1] = v[1];
  u[2] = v[2];
  u[3] = v[3];

  u[4] = _mm256_mullo_epi32(v[4], cospi16);
  x = _mm256_mullo_epi32(v[5], cospi48);
  u[4] = _mm256_add_epi32(u[4], x);
  u[4] = _mm256_add_epi32(u[4], rnding);
  u[4] = _mm256_srai_epi32(u[4], bit);

  u[5] = _mm256_mullo_epi32(v[4], cospi48);
  x = _mm256_mullo_epi32(v[5], cospi16);
  u[5] = _mm256_sub_epi32(u[5], x);
  u[5] = _mm256_add_epi32(u[5], rnding);
  u[5] = _mm256_srai_epi32(u[5], bit);

  u[6] = _mm256_mullo_epi32(v[6], cospim48);
  x = _mm256_mullo_epi32(v[7], cospi16);
  u[6] = _mm256_add_epi32(u[6], x);
  u[6] = _mm256_add_epi32(u[6], rnding);
  u[6] = _mm256_srai_epi32(u[6], bit);

  u[7] = _mm256_mullo_epi32(v[6], cospi16);
  x = _mm256_mullo_epi32(v[7], cospim48);
  u[7] = _mm256_sub_epi32(u[7], x);
  u[7] = _mm256_add_epi32(u[7], rnding);
  u[7] = _mm256_srai_epi32(u[7], bit);

  // stage 5
  addsub_avx2(u[0], u[2], &v[0], &v[2], &clamp_lo, &clamp_hi);
  addsub_avx2(u[1], u[3], &v[1], &v[3], &clamp_lo, &clamp_hi);
  addsub_avx2(u[4], u[6], &v[4], &v[6], &clamp_lo, &clamp_hi);
  addsub_avx2(u[5], u[7], &v[5], &v[7], &clamp_lo, &clamp_hi);

  // stage 6
  u[0] = v[0];
  u[1] = v[1];
  u[4] = v[4];
  u[5] = v[5];

  v[0] = _mm256_mullo_epi32(v[2], cospi32);
  x = _mm256_mullo_epi32(v[3], cospi32);
  u[2] = _mm256_add_epi32(v[0], x);
  u[2] = _mm256_add_epi32(u[2], rnding);
  u[2] = _mm256_srai_epi32(u[2], bit);

  u[3] = _mm256_sub_epi32(v[0], x);
  u[3] = _mm256_add_epi32(u[3], rnding);
  u[3] = _mm256_srai_epi32(u[3], bit);

  v[0] = _mm256_mullo_epi32(v[6], cospi32);
  x = _mm256_mullo_epi32(v[7], cospi32);
  u[6] = _mm256_add_epi32(v[0], x);
  u[6] = _mm256_add_epi32(u[6], rnding);
  u[6] = _mm256_srai_epi32(u[6], bit);

  u[7] = _mm256_sub_epi32(v[0], x);
  u[7] = _mm256_add_epi32(u[7], rnding);
  u[7] = _mm256_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[0] = u[0];
    out[1] = _mm256_sub_epi32(kZero, u[4]);
    out[2] = u[6];
    out[3] = _mm256_sub_epi32(kZero, u[2]);
    out[4] = u[3];
    out[5] = _mm256_sub_epi32(kZero, u[7]);
    out[6] = u[5];
    out[7] = _mm256_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m256i clamp_lo_out = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
    const __m256i clamp_hi_out =
        _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_avx2(u[0], u[4], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[6], u[2], out + 2, out + 3, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[3], u[7], out + 4, out + 5, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[5], u[1], out + 6, out + 7, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
  }
}